

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

int joinline(int f,int n)

{
  int iVar1;
  int f_00;
  
  undo_boundary_enable(8,0);
  if ((f & 7U) == 0) {
    gotobol(8,1);
    f_00 = 8;
    iVar1 = 1;
    backdel(8,1);
  }
  else {
    gotoeol(8,1);
    f_00 = 1;
    iVar1 = 0;
    ldelete(1,0);
  }
  delwhite(f_00,iVar1);
  iVar1 = curwp->w_doto;
  if (0 < iVar1) {
    linsert(1,0x20);
    curwp->w_doto = iVar1;
  }
  undo_boundary_enable(8,1);
  return 1;
}

Assistant:

int
joinline(int f, int n)
{
	int doto;

	undo_boundary_enable(FFRAND, 0);
	if (f & FFARG) {
		gotoeol(FFRAND, 1);
		forwdel(FFRAND, 1);
	} else {
		gotobol(FFRAND, 1);
		backdel(FFRAND, 1);
	}

	delwhite(FFRAND, 1);

	if ((doto = curwp->w_doto) > 0) {
		linsert(1, ' ');
		curwp->w_doto = doto;
	}
	undo_boundary_enable(FFRAND, 1);

	return (TRUE);
}